

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

char * mz_zip_get_error_string(mz_zip_error mz_err)

{
  if (mz_err < MZ_ZIP_TOTAL_ERRORS) {
    return &DAT_0015f1b0 + *(int *)(&DAT_0015f1b0 + (ulong)mz_err * 4);
  }
  return "unknown error";
}

Assistant:

inline const char* mz_zip_get_error_string(mz_zip_error mz_err) {

    switch (mz_err) {
        case MZ_ZIP_NO_ERROR:return "no error";
        case MZ_ZIP_UNDEFINED_ERROR:return "undefined error";
        case MZ_ZIP_TOO_MANY_FILES:return "too many files";
        case MZ_ZIP_FILE_TOO_LARGE:return "file too large";
        case MZ_ZIP_UNSUPPORTED_METHOD:return "unsupported method";
        case MZ_ZIP_UNSUPPORTED_ENCRYPTION:return "unsupported encryption";
        case MZ_ZIP_UNSUPPORTED_FEATURE:return "unsupported feature";
        case MZ_ZIP_FAILED_FINDING_CENTRAL_DIR:return "failed finding central directory";
        case MZ_ZIP_NOT_AN_ARCHIVE:return "not a ZIP archive";
        case MZ_ZIP_INVALID_HEADER_OR_CORRUPTED:return "invalid header or archive is corrupted";
        case MZ_ZIP_UNSUPPORTED_MULTIDISK:return "unsupported multidisk archive";
        case MZ_ZIP_DECOMPRESSION_FAILED:return "decompression failed or archive is corrupted";
        case MZ_ZIP_COMPRESSION_FAILED:return "compression failed";
        case MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE:return "unexpected decompressed size";
        case MZ_ZIP_CRC_CHECK_FAILED:return "CRC-32 check failed";
        case MZ_ZIP_UNSUPPORTED_CDIR_SIZE:return "unsupported central directory size";
        case MZ_ZIP_ALLOC_FAILED:return "allocation failed";
        case MZ_ZIP_FILE_OPEN_FAILED:return "file open failed";
        case MZ_ZIP_FILE_CREATE_FAILED:return "file create failed";
        case MZ_ZIP_FILE_WRITE_FAILED:return "file write failed";
        case MZ_ZIP_FILE_READ_FAILED:return "file read failed";
        case MZ_ZIP_FILE_CLOSE_FAILED:return "file close failed";
        case MZ_ZIP_FILE_SEEK_FAILED:return "file seek failed";
        case MZ_ZIP_FILE_STAT_FAILED:return "file stat failed";
        case MZ_ZIP_INVALID_PARAMETER:return "invalid parameter";
        case MZ_ZIP_INVALID_FILENAME:return "invalid filename";
        case MZ_ZIP_BUF_TOO_SMALL:return "buffer too small";
        case MZ_ZIP_INTERNAL_ERROR:return "internal error";
        case MZ_ZIP_FILE_NOT_FOUND:return "file not found";
        case MZ_ZIP_ARCHIVE_TOO_LARGE:return "archive is too large";
        case MZ_ZIP_VALIDATION_FAILED:return "validation failed";
        case MZ_ZIP_WRITE_CALLBACK_FAILED:return "write calledback failed";
        default:break;
    }

    return "unknown error";
}